

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_conv.cpp
# Opt level: O1

MatrixXd * __thiscall
LayerConv::img2mat(MatrixXd *__return_storage_ptr__,LayerConv *this,ImageVolume *input,
                  LayerSize *output_size,size_t f,int p,int s)

{
  LayerSize *pLVar1;
  ulong uVar2;
  undefined8 *puVar3;
  PointerType pdVar4;
  ulong uVar5;
  pointer pvVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  SrcEvaluatorType srcEvaluator;
  MatrixXd channel_pad;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator_1;
  assign_op<double,_double> local_191;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_190;
  ulong local_188;
  DstXprType local_180;
  ulong local_148;
  long local_140;
  size_t local_138;
  DenseStorage<double,__1,__1,__1,_0> local_130;
  void *local_118;
  long local_110;
  long local_108;
  long local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  long local_e0;
  LayerSize *local_d8;
  long local_d0;
  ulong local_c8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_c0;
  long local_a0;
  ulong local_98;
  ImageVolume *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  DstEvaluatorType local_58;
  double *local_40;
  ulong local_38;
  
  pvVar6 = (input->
           super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar12 = *(long *)&(pvVar6->
                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     )._M_impl.super__Vector_impl_data;
  local_f0 = *(ulong *)(lVar12 + 8);
  local_f8 = *(ulong *)(lVar12 + 0x10);
  lVar7 = output_size->cols * output_size->rows;
  local_180.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)(local_f0 + (long)(p * 2));
  local_180.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (long)(p * 2) + local_f8;
  local_180.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = 0;
  local_190 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__;
  local_d8 = output_size;
  if (-1 < (long)(local_180.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                  .m_rows.m_value |
                 (ulong)local_180.
                        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                        .m_data)) {
    local_188 = f * f;
    uVar11 = local_188 * -0x5555555555555555 *
             ((long)*(pointer *)
                     ((long)&(pvVar6->
                             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             )._M_impl.super__Vector_impl_data + 8) - lVar12 >> 3);
    pdVar4 = (PointerType)
             (((long)(input->
                     super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
              -0x5555555555555555 * lVar7);
    local_138 = f;
    local_100 = lVar7;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_118,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_180);
    local_180.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
    m_value = 0;
    local_180.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
         pdVar4;
    local_180.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
    m_value = uVar11;
    if (-1 < (long)((ulong)pdVar4 | uVar11)) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                (local_190,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_180);
      if ((input->
          super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish !=
          (input->
          super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        uVar8 = (ulong)p;
        local_78 = local_f8 | local_f0;
        local_80 = local_f0 | uVar8;
        local_88 = local_f8 | uVar8;
        local_d0 = (long)s;
        local_a0 = local_188 * 8;
        local_e0 = 0;
        local_148 = 0;
        lVar12 = local_100;
        uVar11 = local_f0;
        uVar5 = local_f8;
        local_98 = uVar8;
        local_90 = input;
        do {
          pvVar6 = (input->
                   super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(pvVar6->
                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       )._M_impl.super__Vector_impl_data + 8) !=
              (pvVar6->
              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              )._M_impl.super__Vector_impl_data._M_start) {
            local_70 = local_148 * 3;
            local_140 = 0;
            uVar10 = 0;
            do {
              local_180.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_data = (PointerType)((long)local_118 + local_110 * uVar8 * 8 + uVar8 * 8);
              puVar3 = (undefined8 *)
                       (uVar10 * 0x18 +
                       *(long *)((long)&(pvVar6->
                                        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                        )._M_impl.super__Vector_impl_data + local_70 * 8));
              local_180.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_rows.m_value = uVar11;
              local_180.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_cols.m_value = uVar5;
              if (local_118 != (void *)0x0 && (long)local_78 < 0) {
LAB_00114033:
                __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/MapBase.h"
                              ,0xb0,
                              "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, Level = 0]"
                             );
              }
              local_180.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_xpr = (XprTypeNested)&local_118;
              local_180.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_outerStride = local_110;
              local_180.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_startRow.m_value = uVar8;
              local_180.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_startCol.m_value = uVar8;
              if (((((long)local_80 < 0) || ((long)local_88 < 0)) ||
                  ((long)(local_110 - uVar11) < (long)uVar8)) ||
                 ((long)(local_108 - uVar5) < (long)uVar8)) {
LAB_00114014:
                __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/Block.h"
                              ,0x93,
                              "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                             );
              }
              local_130.m_data = (double *)*puVar3;
              local_130.m_rows = puVar3[1];
              if ((uVar11 != local_130.m_rows) || (uVar5 != puVar3[2])) {
LAB_00114052:
                __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/DenseBase.h"
                              ,0x101,
                              "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>]"
                             );
              }
              local_58.
              super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              .m_outerStride.m_value = local_110;
              local_c0.m_dst = &local_58;
              local_c0.m_functor = (assign_op<double,_double> *)&local_40;
              local_c0.m_dstExpr = &local_180;
              local_e8 = uVar10;
              local_c0.m_src = (SrcEvaluatorType *)&local_130;
              local_58.
              super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              .m_data = local_180.
                        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                        .m_data;
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
              ::run(&local_c0);
              if (0 < local_d8->rows) {
                local_c8 = local_e8 * local_188;
                local_68 = local_c8 | local_188;
                uVar11 = 0;
                iVar9 = 0;
                pLVar1 = local_d8;
                do {
                  if (0 < pLVar1->cols) {
                    local_60 = uVar11 | local_138;
                    uVar5 = iVar9 + local_e0;
                    lVar12 = uVar5 * 8;
                    uVar8 = 0;
                    do {
                      local_180.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_data = (PointerType)((long)local_118 + local_110 * uVar8 * 8 + uVar11 * 8);
                      local_180.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_rows.m_value = local_138;
                      local_180.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_cols.m_value = local_138;
                      if (local_118 != (void *)0x0 && (long)local_138 < 0) goto LAB_00114033;
                      local_180.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_xpr = (XprTypeNested)&local_118;
                      local_180.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_outerStride = local_110;
                      local_180.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_startRow.m_value = uVar11;
                      local_180.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_startCol.m_value = uVar8;
                      if ((((long)local_60 < 0) || ((long)(uVar8 | local_138) < 0)) ||
                         (((long)(local_110 - local_138) < (long)uVar11 ||
                          ((long)(local_108 - local_138) < (long)uVar8)))) goto LAB_00114014;
                      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
                                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_130,
                                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                                  *)&local_180);
                      Eigen::internal::
                      inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false,_false>
                      ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_130);
                      uVar10 = local_188;
                      if ((long)local_188 < 0) {
                        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/PlainObjectBase.h"
                                      ,0x11d,
                                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                                     );
                      }
                      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                                (&local_130,local_188,1,local_188);
                      local_180.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_outerStride = *(Index *)(local_190 + 8);
                      local_180.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_data = (PointerType)
                                (local_140 *
                                 local_180.
                                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                                 .
                                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                                 .m_outerStride + *(long *)local_190 + lVar12);
                      local_180.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_rows.m_value = 1;
                      local_180.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_cols.m_value = uVar10;
                      local_180.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_xpr = (XprTypeNested)local_190;
                      local_180.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_startCol.m_value = local_c8;
                      local_180.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_startRow.m_value = uVar5;
                      if (((((long)uVar5 < 0) || ((long)local_68 < 0)) ||
                          (local_180.
                           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                           .m_outerStride <= (long)uVar5)) ||
                         ((long)(*(long *)(local_190 + 0x10) - local_188) < (long)local_c8))
                      goto LAB_00114014;
                      local_40 = local_130.m_data;
                      local_38 = local_130.m_rows;
                      if ((local_130.m_rows != 1) || (local_188 != local_130.m_cols))
                      goto LAB_00114052;
                      local_c0.m_dst = &local_58;
                      local_c0.m_src = (SrcEvaluatorType *)&local_40;
                      local_c0.m_functor = &local_191;
                      local_c0.m_dstExpr = &local_180;
                      local_58.
                      super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      .m_data = local_180.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                                .m_data;
                      local_58.
                      super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      .m_outerStride.m_value =
                           local_180.
                           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                           .m_outerStride;
                      Eigen::internal::
                      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                      ::run(&local_c0);
                      free(local_130.m_data);
                      uVar8 = uVar8 + local_d0;
                      uVar5 = uVar5 + 1;
                      lVar12 = lVar12 + 8;
                      iVar9 = iVar9 + 1;
                      pLVar1 = local_d8;
                    } while ((long)uVar8 < local_d8->cols);
                  }
                  uVar11 = uVar11 + local_d0;
                } while ((long)uVar11 < pLVar1->rows);
              }
              uVar10 = local_e8 + 1;
              pvVar6 = (local_90->
                       super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar2 = ((long)*(pointer *)
                              ((long)&(pvVar6->
                                      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                      )._M_impl.super__Vector_impl_data + 8) -
                       *(long *)&(pvVar6->
                                 super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                 )._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555;
              local_140 = local_140 + local_a0;
              lVar12 = local_100;
              uVar11 = local_f0;
              uVar5 = local_f8;
              uVar8 = local_98;
              input = local_90;
            } while (uVar10 <= uVar2 && uVar2 - uVar10 != 0);
          }
          local_148 = local_148 + 1;
          uVar10 = ((long)(input->
                          super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(input->
                          super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          local_e0 = local_e0 + lVar12;
        } while (local_148 <= uVar10 && uVar10 - local_148 != 0);
      }
      free(local_118);
      return (MatrixXd *)local_190;
    }
  }
  local_180.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = 0;
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

Eigen::MatrixXd LayerConv::img2mat(const ImageVolume& input, const LayerSize& output_size, size_t f, int p, int s) {
	auto f_size = f * f; // filter total size.
	auto rows = input[0][0].rows();
	auto cols = input[0][0].cols();
	auto conv_size = output_size.rows * output_size.cols;
	auto rows_input_mat = conv_size * input.size();
	auto cols_input_mat = input[0].size() * f_size;
	MatrixXd channel_pad = MatrixXd::Constant(rows + 2 * p, cols + 2 * p, 0);
	MatrixXd input_mat = MatrixXd::Constant(rows_input_mat, cols_input_mat, 0);
	for (auto img_ind = 0; img_ind < input.size(); img_ind++) {
		for (auto c = 0; c < input[0].size(); c++) {
			auto& channel = input[img_ind][c];
			channel_pad.block(p, p, rows, cols) = channel;
			for (int i = 0, row = 0; i < output_size.rows; i += s) {
				for (int j = 0; j < output_size.cols; j += s, row++) {
					MatrixXd v = channel_pad.block(i, j, f, f);
					v.transposeInPlace();
					v.resize(1, f_size);
					input_mat.block(img_ind * conv_size + row, c * f_size, 1, f_size) = v;
				}
			}
		}
	}

	return input_mat;
}